

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

natwm_error client_set_fullscreen(natwm_state *state,client *client)

{
  workspace *workspace_00;
  monitor *pmVar1;
  monitor *monitor;
  workspace *workspace;
  client *client_local;
  natwm_state *state_local;
  
  workspace_00 = workspace_list_find_client_workspace(state->workspace_list,client);
  pmVar1 = monitor_list_get_workspace_monitor(state->monitor_list,workspace_00);
  if (pmVar1 == (monitor *)0x0) {
    state_local._4_4_ = RESOLUTION_FAILURE;
  }
  else {
    client->is_fullscreen = true;
    ewmh_add_window_state(state,client->window,state->ewmh->_NET_WM_STATE_FULLSCREEN);
    client_configure_window_rect(state->xcb,client->window,pmVar1->rect,0);
    state_local._4_4_ = NO_ERROR;
  }
  return state_local._4_4_;
}

Assistant:

enum natwm_error client_set_fullscreen(const struct natwm_state *state, struct client *client)
{
        struct workspace *workspace
                = workspace_list_find_client_workspace(state->workspace_list, client);
        struct monitor *monitor
                = monitor_list_get_workspace_monitor(state->monitor_list, workspace);

        if (monitor == NULL) {
                return RESOLUTION_FAILURE;
        }

        client->is_fullscreen = true;

        ewmh_add_window_state(state, client->window, state->ewmh->_NET_WM_STATE_FULLSCREEN);

        client_configure_window_rect(state->xcb, client->window, monitor->rect, 0);

        return NO_ERROR;
}